

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O1

int stless_(double *y,int *n,int *len,int *ideg,int *njump,int *userw,double *rw,double *ys,
           double *res)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  bool bVar4;
  uint *puVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  uint uVar15;
  double local_70;
  double d__1;
  ulong local_60;
  long local_58;
  double *local_50;
  uint *local_48;
  int local_40;
  int local_3c;
  int ok;
  uint local_34;
  int nleft;
  int nright;
  
  if (*n < 2) {
    *ys = *y;
  }
  else {
    local_50 = y;
    local_3c = imin(*njump,*n + -1);
    uVar15 = *len;
    uVar9 = *n;
    local_60 = (ulong)(int)uVar9;
    d__1 = (double)len;
    local_48 = (uint *)n;
    if ((int)uVar15 < (int)uVar9) {
      if (local_3c == 1) {
        ok = 1;
        local_34 = uVar15;
        if (0 < (int)uVar9) {
          local_60 = (ulong)((int)((uVar15 - ((int)(uVar15 + 1) >> 0x1f)) + 1) >> 1);
          local_58 = CONCAT44(local_58._4_4_,1);
          lVar10 = 1;
          do {
            if (((long)local_60 < lVar10) && (uVar15 != *local_48)) {
              ok = (int)local_58 + 1;
              local_58 = CONCAT44(local_58._4_4_,ok);
              uVar15 = uVar15 + 1;
              local_34 = uVar15;
            }
            local_70 = (double)(int)lVar10;
            stlest_(local_50,(int *)local_48,(int *)d__1,ideg,&local_70,ys + lVar10 + -1,&ok,
                    (int *)&local_34,res,userw,rw,&local_40);
            if (local_40 == 0) {
              ys[lVar10 + -1] = local_50[lVar10 + -1];
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != (ulong)uVar9 + 1);
        }
      }
      else {
        bVar4 = 0 < (int)uVar9;
        if (local_3c < 0) {
          bVar4 = (int)uVar9 < 2;
        }
        if (bVar4) {
          iVar8 = (int)((uVar15 - ((int)(uVar15 + 1) >> 0x1f)) + 1) >> 1;
          local_58 = (long)local_3c;
          lVar10 = 1;
          do {
            if (lVar10 < iVar8) {
              ok = 1;
              local_34 = *(uint *)d__1;
            }
            else {
              local_34 = *local_48;
              if ((int)(local_34 - iVar8) < lVar10) {
                ok = (local_34 - *(int *)d__1) + 1;
              }
              else {
                iVar6 = (int)lVar10 - iVar8;
                ok = iVar6 + 1;
                local_34 = iVar6 + *(int *)d__1;
              }
            }
            local_70 = (double)(int)lVar10;
            stlest_(local_50,(int *)local_48,(int *)d__1,ideg,&local_70,ys + lVar10 + -1,&ok,
                    (int *)&local_34,res,userw,rw,&local_40);
            if (local_40 == 0) {
              ys[lVar10 + -1] = local_50[lVar10 + -1];
            }
            lVar10 = lVar10 + local_58;
            bVar4 = lVar10 <= (long)local_60;
            if (local_3c < 0) {
              bVar4 = (long)local_60 <= lVar10;
            }
          } while (bVar4);
        }
      }
    }
    else {
      ok = 1;
      bVar4 = 0 < (int)uVar9;
      if (local_3c < 0) {
        bVar4 = (int)uVar9 < 2;
      }
      local_34 = uVar9;
      if (bVar4) {
        lVar10 = (long)local_3c;
        local_58 = lVar10 * 8;
        iVar8 = 1;
        lVar7 = 0;
        pdVar14 = ys;
        do {
          local_70 = (double)iVar8;
          stlest_(local_50,(int *)local_48,(int *)d__1,ideg,&local_70,pdVar14,&ok,(int *)&local_34,
                  res,userw,rw,&local_40);
          if (local_40 == 0) {
            *pdVar14 = local_50[lVar7];
          }
          lVar12 = lVar10 + 1 + lVar7;
          bVar4 = lVar12 <= (long)local_60;
          if (local_3c < 0) {
            bVar4 = (long)local_60 <= lVar12;
          }
          iVar8 = iVar8 + local_3c;
          pdVar14 = (double *)((long)pdVar14 + local_58);
          lVar7 = lVar7 + lVar10;
        } while (bVar4);
      }
    }
    puVar5 = local_48;
    pdVar14 = local_50;
    if (local_3c != 1) {
      uVar15 = *local_48;
      iVar8 = uVar15 - local_3c;
      bVar4 = 0 < iVar8;
      if (local_3c < 0) {
        bVar4 = iVar8 < 2;
      }
      if (bVar4) {
        lVar7 = (long)local_3c;
        pdVar11 = ys;
        lVar10 = 1;
        do {
          lVar12 = lVar10 + lVar7;
          if (lVar10 < lVar10 + lVar7 + -1) {
            dVar1 = ys[lVar12 + -1];
            dVar2 = ys[lVar10 + -1];
            lVar13 = 1;
            do {
              pdVar11[lVar13] =
                   (double)(int)lVar13 * ((dVar1 - dVar2) / (double)local_3c) + ys[lVar10 + -1];
              lVar13 = lVar13 + 1;
            } while (local_3c != (int)lVar13);
          }
          bVar4 = lVar12 <= iVar8;
          if (local_3c < 0) {
            bVar4 = iVar8 <= lVar12;
          }
          pdVar11 = pdVar11 + lVar7;
          lVar10 = lVar12;
        } while (bVar4);
      }
      local_3c = (int)(uVar15 - 1) % local_3c;
      uVar9 = (uVar15 - 1) - local_3c;
      local_60 = (ulong)uVar9;
      uVar9 = uVar9 + 1;
      if (uVar9 != uVar15) {
        local_70 = (double)(int)uVar15;
        stlest_(local_50,(int *)local_48,(int *)d__1,ideg,&local_70,ys + (long)(int)uVar15 + -1,&ok,
                (int *)&local_34,res,userw,rw,&local_40);
        if (local_40 == 0) {
          lVar10 = (long)(int)*puVar5;
          ys[lVar10 + -1] = pdVar14[lVar10 + -1];
        }
        uVar3 = *puVar5;
        if (((int)local_60 != uVar3 - 2) && (iVar8 = (int)local_60 + 2, iVar8 < (int)uVar3)) {
          dVar1 = ys[(long)(int)uVar3 + -1];
          dVar2 = ys[(long)(int)uVar9 + -1];
          lVar10 = 0;
          do {
            iVar6 = (int)(lVar10 + 1);
            ys[(long)iVar8 + lVar10 + -1] =
                 (double)iVar6 * ((dVar1 - dVar2) / (double)(int)(uVar3 - uVar9)) +
                 ys[(long)(int)uVar9 + -1];
            lVar10 = lVar10 + 1;
          } while (~uVar15 + local_3c + uVar3 != iVar6);
        }
      }
    }
  }
  return 0;
}

Assistant:

int stless_(double *y, int *n, int *len, int *ideg, int *njump, int *userw, double *rw, double *ys,
	 double *res)
{
    /* System generated locals */
    int i__1, i__2, i__3;
    double d__1;

    /* Local variables */
    int i__, j, k;
    int ok;
    int nsh;
    double delta;
    int nleft, newnj, nright;

/* Arg */
/* Var */
    /* Parameter adjustments */
    --res;
    --ys;
    --rw;
    --y;

    /* Function Body */
    if (*n < 2) {
	ys[1] = y[1];
	return 0;
    }
/* Computing MIN */
    i__1 = *njump, i__2 = *n - 1;
    newnj = imin(i__1,i__2);
    if (*len >= *n) {
	nleft = 1;
	nright = *n;
	i__1 = *n;
	i__2 = newnj;
	for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
	    d__1 = (double) i__;
	    stlest_(&y[1], n, len, ideg, &d__1, &ys[i__], &nleft, &nright, &
		    res[1], userw, &rw[1], &ok);
	    if (! ok) {
		ys[i__] = y[i__];
	    }
/* L20: */
	}
    } else {
	if (newnj == 1) {
	    nsh = (*len + 1) / 2;
	    nleft = 1;
	    nright = *len;
	    i__2 = *n;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		if (i__ > nsh && nright != *n) {
		    ++nleft;
		    ++nright;
		}
		d__1 = (double) i__;
		stlest_(&y[1], n, len, ideg, &d__1, &ys[i__], &nleft, &nright,
			 &res[1], userw, &rw[1], &ok);
		if (! ok) {
		    ys[i__] = y[i__];
		}
/* L30: */
	    }
	} else {
	    nsh = (*len + 1) / 2;
	    i__2 = *n;
	    i__1 = newnj;
	    for (i__ = 1; i__1 < 0 ? i__ >= i__2 : i__ <= i__2; i__ += i__1) {
		if (i__ < nsh) {
		    nleft = 1;
		    nright = *len;
		} else if (i__ >= *n - nsh + 1) {
		    nleft = *n - *len + 1;
		    nright = *n;
		} else {
		    nleft = i__ - nsh + 1;
		    nright = *len + i__ - nsh;
		}
		d__1 = (double) i__;
		stlest_(&y[1], n, len, ideg, &d__1, &ys[i__], &nleft, &nright,
			 &res[1], userw, &rw[1], &ok);
		if (! ok) {
		    ys[i__] = y[i__];
		}
/* L40: */
	    }
	}
    }
    if (newnj != 1) {
	i__1 = *n - newnj;
	i__2 = newnj;
	for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
	    delta = (ys[i__ + newnj] - ys[i__]) / (double) newnj;
	    i__3 = i__ + newnj - 1;
	    for (j = i__ + 1; j <= i__3; ++j) {
		ys[j] = ys[i__] + delta * (double) (j - i__);
/* L47: */
	    }
/* L45: */
	}
	k = (*n - 1) / newnj * newnj + 1;
	if (k != *n) {
	    d__1 = (double) (*n);
	    stlest_(&y[1], n, len, ideg, &d__1, &ys[*n], &nleft, &nright, &
		    res[1], userw, &rw[1], &ok);
	    if (! ok) {
		ys[*n] = y[*n];
	    }
	    if (k != *n - 1) {
		delta = (ys[*n] - ys[k]) / (double) (*n - k);
		i__2 = *n - 1;
		for (j = k + 1; j <= i__2; ++j) {
		    ys[j] = ys[k] + delta * (double) (j - k);
/* L55: */
		}
	    }
	}
    }
	return 0;
}